

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityPrintFloat(UNITY_DOUBLE input_number)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  char *string;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  char buf [16];
  char acStack_3a [26];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((input_number < 0.0) ||
     (((input_number == 0.0 && (!NAN(input_number))) && (1.0 / input_number < 0.0)))) {
    putchar(0x2d);
    input_number = -input_number;
  }
  if ((input_number == 0.0) && (!NAN(input_number))) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      string = "0";
LAB_00106b87:
      UnityPrint(string);
      return;
    }
    goto LAB_00106e5c;
  }
  if (NAN(input_number)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      string = "nan";
      goto LAB_00106b87;
    }
    goto LAB_00106e5c;
  }
  if (NAN(input_number - input_number)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      string = "inf";
      goto LAB_00106b87;
    }
    goto LAB_00106e5c;
  }
  iVar3 = 0;
  if (input_number < 0.10000000149011612) {
    iVar3 = 0;
    do {
      input_number = input_number * 1000000.0;
      iVar3 = iVar3 + -6;
    } while (input_number < 0.10000000149011612);
  }
  for (; input_number < 100000.0; input_number = input_number * 10.0) {
    iVar3 = iVar3 + -1;
  }
  for (; 999999995904.0 < input_number; input_number = input_number / 1000000.0) {
    iVar3 = iVar3 + 6;
  }
  for (; 1000000.0 < input_number; input_number = input_number / 10.0) {
    iVar3 = iVar3 + 1;
  }
  iVar1 = (int)(input_number + input_number);
  iVar2 = 100000;
  if (iVar1 < 1999999) {
    iVar2 = (iVar1 - (iVar1 + 1 >> 0x1f)) + 1 >> 1;
  }
  iVar5 = iVar3 + (uint)(0x1e847e < iVar1);
  uVar4 = 5;
  if (iVar3 + (uint)(0x1e847e < iVar1) + 9 < 10) {
    uVar4 = -iVar5;
  }
  uVar6 = iVar5 + uVar4;
  if (((int)uVar4 < 1) || (uVar9 = uVar4, iVar2 % 10 != 0)) {
    if ((iVar2 != 0) || (-1 < (int)uVar4)) goto LAB_00106cfa;
  }
  else {
    do {
      iVar2 = iVar2 / 10;
      uVar4 = uVar9 - 1;
      if (uVar9 < 2) break;
      uVar9 = uVar4;
    } while (iVar2 % 10 == 0);
LAB_00106cfa:
    lVar11 = 0;
    uVar9 = 1;
    do {
      do {
        uVar8 = uVar9;
        lVar7 = lVar11;
        iVar3 = iVar2 / 10;
        lVar11 = lVar7 + 1;
        acStack_3a[lVar7 + 2] = (char)iVar2 + (char)iVar3 * -10 + '0';
        uVar10 = iVar2 - 10;
        uVar9 = uVar8 + 1;
        iVar2 = iVar3;
      } while (uVar10 < 0xffffffed);
    } while (lVar7 < (int)uVar4);
    if (0 < (int)lVar11) {
      lVar11 = (ulong)(uVar8 & 0x7fffffff) + 1;
      do {
        if (lVar11 - (ulong)uVar4 == 1) {
          putchar(0x2e);
        }
        putchar((int)acStack_3a[lVar11]);
        lVar11 = lVar11 + -1;
      } while (1 < lVar11);
    }
  }
  if (uVar6 != 0) {
    putchar(0x65);
    if ((int)uVar6 < 0) {
      putchar(0x2d);
      uVar6 = -uVar6;
    }
    else {
      putchar(0x2b);
    }
    uVar12 = 0xffffffffffffffff;
    do {
      acStack_3a[uVar12 + 3] = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
      bVar13 = 9 < uVar6;
      uVar12 = uVar12 + 1;
      uVar6 = uVar6 / 10;
    } while (uVar12 == 0 || bVar13);
    do {
      putchar((int)acStack_3a[(uVar12 & 0xffffffff) + 2]);
      uVar12 = uVar12 - 1;
    } while (1 < (int)uVar12 + 2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_00106e5c:
  __stack_chk_fail();
}

Assistant:

void UnityPrintFloat(const UNITY_DOUBLE input_number)
{
    UNITY_DOUBLE number = input_number;

    /* print minus sign (including for negative zero) */
    if (number < (double)0.0f || (number == (double)0.0f && (double)1.0f / number < (double)0.0f))
    {
        UNITY_OUTPUT_CHAR('-');
        number = -number;
    }

    /* handle zero, NaN, and +/- infinity */
    if (number == (double)0.0f) UnityPrint("0");
    else if (isnan(number)) UnityPrint("nan");
    else if (isinf(number)) UnityPrint("inf");
    else
    {
        int exponent = 0;
        int decimals, digits;
        UNITY_INT32 n;
        char buf[16];

        /* scale up or down by powers of 10 */
        while (number < (double)(100000.0f / 1e6f))  { number *= (double)1e6f; exponent -= 6; }
        while (number < (double)100000.0f)         { number *= (double)10.0f; exponent--; }
        while (number > (double)(1000000.0f * 1e6f)) { number /= (double)1e6f; exponent += 6; }
        while (number > (double)1000000.0f)        { number /= (double)10.0f; exponent++; }

        /* round to nearest integer */
        n = ((UNITY_INT32)(number + number) + 1) / 2;
        if (n > 999999)
        {
            n = 100000;
            exponent++;
        }

        /* determine where to place decimal point */
        decimals = (exponent <= 0 && exponent >= -9) ? -exponent : 5;
        exponent += decimals;

        /* truncate trailing zeroes after decimal point */
        while (decimals > 0 && n % 10 == 0)
        {
            n /= 10;
            decimals--;
        }

        /* build up buffer in reverse order */
        digits = 0;
        while (n != 0 || digits < decimals + 1)
        {
            buf[digits++] = (char)('0' + n % 10);
            n /= 10;
        }
        while (digits > 0)
        {
            if(digits == decimals) UNITY_OUTPUT_CHAR('.');
            UNITY_OUTPUT_CHAR(buf[--digits]);
        }

        /* print exponent if needed */
        if (exponent != 0)
        {
            UNITY_OUTPUT_CHAR('e');

            if(exponent < 0)
            {
                UNITY_OUTPUT_CHAR('-');
                exponent = -exponent;
            }
            else
            {
                UNITY_OUTPUT_CHAR('+');
            }

            digits = 0;
            while (exponent != 0 || digits < 2)
            {
                buf[digits++] = (char)('0' + exponent % 10);
                exponent /= 10;
            }
            while (digits > 0)
            {
                UNITY_OUTPUT_CHAR(buf[--digits]);
            }
        }
    }
}